

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tftp.c
# Opt level: O0

CURLcode tftp_setup_connection(connectdata *conn)

{
  Curl_easy *pCVar1;
  char cVar2;
  char *pcStack_20;
  char command;
  char *type;
  Curl_easy *data;
  connectdata *conn_local;
  
  pCVar1 = conn->data;
  conn->socktype = 2;
  pcStack_20 = strstr((pCVar1->state).up.path,";mode=");
  if (pcStack_20 == (char *)0x0) {
    pcStack_20 = strstr((conn->host).rawalloc,";mode=");
  }
  if (pcStack_20 != (char *)0x0) {
    *pcStack_20 = '\0';
    cVar2 = Curl_raw_toupper(pcStack_20[6]);
    switch(cVar2) {
    case 'A':
    case 'N':
      *(ulong *)&(pCVar1->set).field_0x888 =
           *(ulong *)&(pCVar1->set).field_0x888 & 0xfffffffffffff7ff | 0x800;
      break;
    case 'I':
    case 'O':
    default:
      *(ulong *)&(pCVar1->set).field_0x888 =
           *(ulong *)&(pCVar1->set).field_0x888 & 0xfffffffffffff7ff;
    }
  }
  return CURLE_OK;
}

Assistant:

static CURLcode tftp_setup_connection(struct connectdata * conn)
{
  struct Curl_easy *data = conn->data;
  char *type;

  conn->socktype = SOCK_DGRAM;   /* UDP datagram based */

  /* TFTP URLs support an extension like ";mode=<typecode>" that
   * we'll try to get now! */
  type = strstr(data->state.up.path, ";mode=");

  if(!type)
    type = strstr(conn->host.rawalloc, ";mode=");

  if(type) {
    char command;
    *type = 0;                   /* it was in the middle of the hostname */
    command = Curl_raw_toupper(type[6]);

    switch(command) {
    case 'A': /* ASCII mode */
    case 'N': /* NETASCII mode */
      data->set.prefer_ascii = TRUE;
      break;

    case 'O': /* octet mode */
    case 'I': /* binary mode */
    default:
      /* switch off ASCII */
      data->set.prefer_ascii = FALSE;
      break;
    }
  }

  return CURLE_OK;
}